

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

vector<BitState,_std::allocator<BitState>_> *
HdlcSimulationDataGenerator::BytesVectorToBitsVector
          (vector<BitState,_std::allocator<BitState>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *v,U32 numberOfBits)

{
  byte *pbVar1;
  value_type local_40 [2];
  BitState bit;
  uint local_2c;
  byte local_27;
  bool local_26;
  byte local_25;
  U32 i;
  U8 bytePos;
  bool getByte;
  U8 byte;
  U32 vectorIndex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  U32 numberOfBits_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_local;
  vector<BitState,_std::allocator<BitState>_> *bitsRet;
  
  byte = '\0';
  vectorIndex = numberOfBits;
  pvStack_18 = v;
  v_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  std::vector<BitState,_std::allocator<BitState>_>::vector(__return_storage_ptr__);
  i = 0;
  local_26 = true;
  local_27 = 0x80;
  for (local_2c = 0; local_2c < vectorIndex; local_2c = local_2c + 1) {
    if (local_26 != false) {
      pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(pvStack_18,(ulong)i);
      local_25 = *pbVar1;
      local_27 = 0x80;
      i = i + 1;
    }
    local_40[0] = (value_type)((local_25 & local_27) != 0);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(__return_storage_ptr__,local_40);
    local_27 = (byte)((int)(uint)local_27 >> 1);
    local_26 = (local_2c + 1 & 7) == 0;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<BitState> HdlcSimulationDataGenerator::BytesVectorToBitsVector( const vector<U8>& v, U32 numberOfBits )
{
    vector<BitState> bitsRet;
    U32 vectorIndex = 0;
    U8 byte;
    bool getByte = true;
    U8 bytePos = 0x80;
    for( U32 i = 0; i < numberOfBits; ++i )
    {
        if( getByte )
        {
            byte = v.at( vectorIndex );
            bytePos = 0x80;
            vectorIndex++;
        }

        BitState bit = ( byte & bytePos ) ? BIT_HIGH : BIT_LOW;
        bitsRet.push_back( bit );

        bytePos >>= 1;

        getByte = ( ( i + 1 ) % 8 == 0 );
    }

    return bitsRet;
}